

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void ma_inn(double *inp,int N,int q,double *theta,int lag)

{
  double *theta_00;
  double *v_00;
  double *thetap;
  double *v;
  int i;
  int lag_local;
  double *theta_local;
  int q_local;
  int N_local;
  double *inp_local;
  
  theta_00 = (double *)malloc((long)(lag + 1) * 8 * (long)(lag + 1));
  v_00 = (double *)malloc((long)(lag + 1) << 3);
  innalg(inp,N,lag,v_00,theta_00);
  for (v._0_4_ = 0; (int)v < q; v._0_4_ = (int)v + 1) {
    theta[(int)v] = -theta_00[lag * (lag + 1) + 1 + (int)v];
  }
  free(v_00);
  free(theta_00);
  return;
}

Assistant:

void ma_inn(double *inp, int N,int q, double* theta, int lag) {

	// Moving Average Parameters for a MA(q) process using Innovations
	// Algorithm. lag is typically set at <= 17
	int i;
	double *v,*thetap;

	thetap = (double*) malloc(sizeof(double) * (lag+1) * (lag+1));
	v = (double*) malloc(sizeof(double) * (lag+1));
	innalg(inp,N,lag,v,thetap);
	for(i = 0; i < q; ++i) {
		theta[i] = -thetap[lag*(lag+1) + 1 + i];
	}

	free(v);
	free(thetap);
}